

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressor.cpp
# Opt level: O2

void __thiscall
Imf_2_5::DwaCompressor::LossyDctDecoderCsc::LossyDctDecoderCsc
          (LossyDctDecoderCsc *this,vector<char_*,_std::allocator<char_*>_> *rowPtrsR,
          vector<char_*,_std::allocator<char_*>_> *rowPtrsG,
          vector<char_*,_std::allocator<char_*>_> *rowPtrsB,char *packedAc,char *packedDc,
          unsigned_short *toLinear,int width,int height,PixelType typeR,PixelType typeG,
          PixelType typeB)

{
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  *this_00;
  vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_> *this_01;
  
  LossyDctDecoderBase::LossyDctDecoderBase
            (&this->super_LossyDctDecoderBase,packedAc,packedDc,toLinear,width,height);
  (this->super_LossyDctDecoderBase)._vptr_LossyDctDecoderBase =
       (_func_int **)&PTR__LossyDctDecoderBase_0037b528;
  this_00 = &(this->super_LossyDctDecoderBase)._rowPtrs;
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back(this_00,rowPtrsR);
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back(this_00,rowPtrsG);
  std::
  vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
  ::push_back(this_00,rowPtrsB);
  this_01 = &(this->super_LossyDctDecoderBase)._type;
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back(this_01,&typeR);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back(this_01,&typeG);
  std::vector<Imf_2_5::PixelType,_std::allocator<Imf_2_5::PixelType>_>::push_back(this_01,&typeB);
  return;
}

Assistant:

LossyDctDecoderCsc
        (std::vector<char *> &rowPtrsR,
         std::vector<char *> &rowPtrsG,
         std::vector<char *> &rowPtrsB,
         char *packedAc,
         char *packedDc,
         const unsigned short *toLinear,
         int width,
         int height,
         PixelType typeR,
         PixelType typeG,
         PixelType typeB)
    :
        LossyDctDecoderBase(packedAc, packedDc, toLinear, width, height)
    {
        _rowPtrs.push_back(rowPtrsR);
        _rowPtrs.push_back(rowPtrsG);
        _rowPtrs.push_back(rowPtrsB);
        _type.push_back(typeR);
        _type.push_back(typeG);
        _type.push_back(typeB);
    }